

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.nalg.c
# Opt level: O2

void pnga_scale(Integer g_a,void *alpha)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  Integer grp_id;
  Integer proc;
  Integer IVar10;
  logical lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  void *ptr;
  Integer elems;
  Integer type;
  Integer ndim;
  Integer _lo [7];
  Integer _hi [7];
  Integer _ld [6];
  Integer _dims [7];
  
  iVar9 = _ga_sync_end;
  iVar8 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  grp_id = pnga_get_pgroup(g_a);
  if (iVar8 != 0) {
    pnga_pgroup_sync(grp_id);
  }
  proc = pnga_pgroup_nodeid(grp_id);
  pnga_check_handle(g_a,"ga_scale");
  IVar10 = pnga_total_blocks(g_a);
  pnga_inquire(g_a,&type,&ndim,_dims);
  if (IVar10 < 0) {
    pnga_distribution(g_a,proc,_lo,_hi);
    lVar11 = pnga_has_ghosts(g_a);
    if (lVar11 != 0) {
      pnga_scale_patch(g_a,_lo,_hi,alpha);
      return;
    }
    if (0 < _lo[0]) {
      pnga_access_ptr(g_a,_lo,_hi,&ptr,_ld);
      elems = (_hi[ndim + -1] - _lo[ndim + -1]) + 1;
      lVar13 = ndim;
      for (lVar14 = 0; lVar14 < lVar13 + -1; lVar14 = lVar14 + 1) {
        lVar12 = (_hi[lVar14] - _lo[lVar14]) + 1;
        if (_ld[lVar14] != lVar12) {
          pnga_error("layout problem",lVar14);
          lVar12 = (_hi[lVar14] - _lo[lVar14]) + 1;
          lVar13 = ndim;
        }
        elems = elems * lVar12;
      }
      switch(type) {
      case 0x3e9:
        lVar14 = 0;
        lVar13 = elems;
        if (elems < 1) {
          lVar13 = lVar14;
        }
        for (; lVar13 != lVar14; lVar14 = lVar14 + 1) {
          *(int *)((long)ptr + lVar14 * 4) = *(int *)((long)ptr + lVar14 * 4) * *alpha;
        }
        break;
      case 0x3ea:
        for (lVar13 = 0; lVar13 < elems; lVar13 = lVar13 + 1) {
          *(long *)((long)ptr + lVar13 * 8) = *(long *)((long)ptr + lVar13 * 8) * *alpha;
        }
        break;
      case 0x3eb:
        lVar14 = 0;
        lVar13 = elems;
        if (elems < 1) {
          lVar13 = lVar14;
        }
        for (; lVar13 != lVar14; lVar14 = lVar14 + 1) {
          *(float *)((long)ptr + lVar14 * 4) = *alpha * *(float *)((long)ptr + lVar14 * 4);
        }
        break;
      case 0x3ec:
        lVar14 = 0;
        lVar13 = elems;
        if (elems < 1) {
          lVar13 = lVar14;
        }
        for (; lVar13 != lVar14; lVar14 = lVar14 + 1) {
          *(double *)((long)ptr + lVar14 * 8) = *alpha * *(double *)((long)ptr + lVar14 * 8);
        }
        break;
      default:
        pnga_error(" wrong data type ",type);
        break;
      case 0x3ee:
        lVar14 = 0;
        lVar13 = elems;
        if (elems < 1) {
          lVar13 = lVar14;
        }
        fVar16 = (float)*alpha;
        fVar17 = (float)((ulong)*alpha >> 0x20);
        for (; lVar13 != lVar14; lVar14 = lVar14 + 1) {
          fVar1 = *(float *)((long)ptr + lVar14 * 8);
          fVar2 = *(float *)((long)ptr + lVar14 * 8 + 4);
          *(ulong *)((long)ptr + lVar14 * 8) =
               CONCAT44(fVar1 * fVar17 + fVar2 * fVar16,fVar1 * fVar16 + -fVar2 * fVar17);
        }
        break;
      case 0x3ef:
        lVar13 = 0;
        if (0 < elems) {
          lVar13 = elems;
        }
        dVar6 = *alpha;
        dVar7 = *(double *)((long)alpha + 8);
        while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
          dVar5 = *(double *)*(undefined1 (*) [16])ptr * dVar7 +
                  *(double *)(*(undefined1 (*) [16])ptr + 8) * dVar6;
          auVar4._8_4_ = SUB84(dVar5,0);
          auVar4._0_8_ = *(double *)*(undefined1 (*) [16])ptr * dVar6 +
                         -*(double *)(*(undefined1 (*) [16])ptr + 8) * dVar7;
          auVar4._12_4_ = (int)((ulong)dVar5 >> 0x20);
          *(undefined1 (*) [16])ptr = auVar4;
          ptr = (void *)((long)ptr + 0x10);
        }
        break;
      case 0x3f8:
        lVar14 = 0;
        lVar13 = elems;
        if (elems < 1) {
          lVar13 = lVar14;
        }
        for (; lVar13 != lVar14; lVar14 = lVar14 + 1) {
          *(long *)((long)ptr + lVar14 * 8) = *(long *)((long)ptr + lVar14 * 8) * *alpha;
        }
      }
      pnga_release_update(g_a,_lo,_hi);
    }
  }
  else {
    pnga_access_block_segment_ptr(g_a,proc,&ptr,&elems);
    switch(type) {
    case 0x3e9:
      lVar13 = 0;
      IVar10 = elems;
      if (elems < 1) {
        IVar10 = lVar13;
      }
      for (; IVar10 != lVar13; lVar13 = lVar13 + 1) {
        *(int *)((long)ptr + lVar13 * 4) = *(int *)((long)ptr + lVar13 * 4) * *alpha;
      }
      break;
    case 0x3ea:
      for (lVar13 = 0; lVar13 < elems; lVar13 = lVar13 + 1) {
        *(long *)((long)ptr + lVar13 * 8) = *(long *)((long)ptr + lVar13 * 8) * *alpha;
      }
      break;
    case 0x3eb:
      lVar13 = 0;
      IVar10 = elems;
      if (elems < 1) {
        IVar10 = lVar13;
      }
      for (; IVar10 != lVar13; lVar13 = lVar13 + 1) {
        *(float *)((long)ptr + lVar13 * 4) = *alpha * *(float *)((long)ptr + lVar13 * 4);
      }
      break;
    case 0x3ec:
      lVar13 = 0;
      IVar10 = elems;
      if (elems < 1) {
        IVar10 = lVar13;
      }
      for (; IVar10 != lVar13; lVar13 = lVar13 + 1) {
        *(double *)((long)ptr + lVar13 * 8) = *alpha * *(double *)((long)ptr + lVar13 * 8);
      }
      break;
    default:
      pnga_error(" wrong data type ",type);
      break;
    case 0x3ee:
      lVar13 = 0;
      IVar10 = elems;
      if (elems < 1) {
        IVar10 = lVar13;
      }
      fVar16 = (float)*alpha;
      fVar17 = (float)((ulong)*alpha >> 0x20);
      for (; IVar10 != lVar13; lVar13 = lVar13 + 1) {
        fVar1 = *(float *)((long)ptr + lVar13 * 8);
        fVar2 = *(float *)((long)ptr + lVar13 * 8 + 4);
        *(ulong *)((long)ptr + lVar13 * 8) =
             CONCAT44(fVar1 * fVar17 + fVar2 * fVar16,fVar1 * fVar16 + -fVar2 * fVar17);
      }
      break;
    case 0x3ef:
      lVar13 = 0;
      if (0 < elems) {
        lVar13 = elems;
      }
      dVar6 = *alpha;
      dVar7 = *(double *)((long)alpha + 8);
      while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
        dVar5 = *(double *)*(undefined1 (*) [16])ptr * dVar7 +
                *(double *)(*(undefined1 (*) [16])ptr + 8) * dVar6;
        auVar3._8_4_ = SUB84(dVar5,0);
        auVar3._0_8_ = *(double *)*(undefined1 (*) [16])ptr * dVar6 +
                       -*(double *)(*(undefined1 (*) [16])ptr + 8) * dVar7;
        auVar3._12_4_ = (int)((ulong)dVar5 >> 0x20);
        *(undefined1 (*) [16])ptr = auVar3;
        ptr = (void *)((long)ptr + 0x10);
      }
      break;
    case 0x3f8:
      lVar13 = 0;
      IVar10 = elems;
      if (elems < 1) {
        IVar10 = lVar13;
      }
      for (; IVar10 != lVar13; lVar13 = lVar13 + 1) {
        *(long *)((long)ptr + lVar13 * 8) = *(long *)((long)ptr + lVar13 * 8) * *alpha;
      }
    }
    pnga_release_update_block_segment(g_a,proc);
  }
  if (iVar9 != 0) {
    pnga_pgroup_sync(grp_id);
  }
  return;
}

Assistant:

void pnga_scale(Integer g_a, void* alpha)
{
  Integer ndim, type, me, elems, grp_id;
  register Integer i;
  Integer num_blocks;
  void *ptr;
  int local_sync_begin,local_sync_end;
  Integer _dims[MAXDIM];
  Integer _ld[MAXDIM-1];
  Integer _lo[MAXDIM];
  Integer _hi[MAXDIM];

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  grp_id = pnga_get_pgroup(g_a);
  if(local_sync_begin)pnga_pgroup_sync(grp_id);

  me = pnga_pgroup_nodeid(grp_id);

  pnga_check_handle(g_a, "ga_scale");
  num_blocks = pnga_total_blocks(g_a);

  pnga_inquire(g_a, &type, &ndim, _dims);
  if (num_blocks < 0) {
    pnga_distribution(g_a, me, _lo, _hi);
    if (pnga_has_ghosts(g_a)) {
      pnga_scale_patch(g_a, _lo, _hi, alpha);
      return;
    }

    if ( _lo[0]> 0 ){ /* base index is 1: we get 0 if no elements stored on p */

      pnga_access_ptr(g_a, _lo, _hi, &ptr, _ld);
      GET_ELEMS(ndim,_lo,_hi,_ld,&elems);

      switch (type){
        int *ia;
        double *da;
        DoubleComplex *ca, scale;
        SingleComplex *cfa, cfscale;
        long *la;
        long long *lla;
        float *fa;
        case C_INT:
        ia = (int*)ptr;
        for(i=0;i<elems;i++) ia[i]  *= *(int*)alpha;
        break;
        case C_LONG:
        la = (long*)ptr;
        for(i=0;i<elems;i++) la[i]  *= *(long*)alpha;
        break;
        case C_LONGLONG:
        lla = (long long*)ptr;
        for(i=0;i<elems;i++) lla[i]  *= *(long long*)alpha;
        break;
        case C_DCPL:
        ca = (DoubleComplex*)ptr;
        scale= *(DoubleComplex*)alpha;
        for(i=0;i<elems;i++){
          DoubleComplex val = ca[i]; 
          ca[i].real = scale.real*val.real  - val.imag * scale.imag;
          ca[i].imag = scale.imag*val.real  + val.imag * scale.real;
        }
        break;
        case C_SCPL:
        cfa = (SingleComplex*)ptr;
        cfscale= *(SingleComplex*)alpha;
        for(i=0;i<elems;i++){
          SingleComplex val = cfa[i]; 
          cfa[i].real = cfscale.real*val.real  - val.imag * cfscale.imag;
          cfa[i].imag = cfscale.imag*val.real  + val.imag * cfscale.real;
        }
        break;
        case C_DBL:
        da = (double*)ptr;
        for(i=0;i<elems;i++) da[i] *= *(double*)alpha;
        break;
        case C_FLOAT:
        fa = (float*)ptr;
        for(i=0;i<elems;i++) fa[i]  *= *(float*)alpha;
        break;       
        default: pnga_error(" wrong data type ",type);
      }

      /* release access to the data */
      pnga_release_update(g_a, _lo, _hi);
    }
  } else {
    pnga_access_block_segment_ptr(g_a, me, &ptr, &elems);
    switch (type){
      int *ia;
      double *da;
      DoubleComplex *ca, scale;
      SingleComplex *cfa, cfscale;
      long *la;
      long long *lla;
      float *fa;
      case C_INT:
      ia = (int*)ptr;
      for(i=0;i<elems;i++) ia[i]  *= *(int*)alpha;
      break;
      case C_LONG:
      la = (long*)ptr;
      for(i=0;i<elems;i++) la[i]  *= *(long*)alpha;
      break;
      case C_LONGLONG:
      lla = (long long*)ptr;
      for(i=0;i<elems;i++) lla[i]  *= *(long long*)alpha;
      break;
      case C_DCPL:
      ca = (DoubleComplex*)ptr;
      scale= *(DoubleComplex*)alpha;
      for(i=0;i<elems;i++){
        DoubleComplex val = ca[i]; 
        ca[i].real = scale.real*val.real  - val.imag * scale.imag;
        ca[i].imag = scale.imag*val.real  + val.imag * scale.real;
      }
      break;
      case C_SCPL:
      cfa = (SingleComplex*)ptr;
      cfscale= *(SingleComplex*)alpha;
      for(i=0;i<elems;i++){
        SingleComplex val = cfa[i]; 
        cfa[i].real = cfscale.real*val.real  - val.imag * cfscale.imag;
        cfa[i].imag = cfscale.imag*val.real  + val.imag * cfscale.real;
      }
      break;
      case C_DBL:
      da = (double*)ptr;
      for(i=0;i<elems;i++) da[i] *= *(double*)alpha;
      break;
      case C_FLOAT:
      fa = (float*)ptr;
      for(i=0;i<elems;i++) fa[i]  *= *(float*)alpha;
      break;       
      default: pnga_error(" wrong data type ",type);
    }
    /* release access to the data */
    pnga_release_update_block_segment(g_a, me);
  }
  if(local_sync_end)pnga_pgroup_sync(grp_id); 
}